

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-queue.h
# Opt level: O3

void __thiscall
kj::ProducerConsumerQueue<unsigned_long>::push
          (ProducerConsumerQueue<unsigned_long> *this,unsigned_long v)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  unsigned_long local_20;
  
  local_20 = v;
  if ((this->waiters).queue.head.ptr == (BaseNode *)0x0) {
    p_Var2 = (_List_node_base *)operator_new(0x18);
    p_Var2[1]._M_next = (_List_node_base *)v;
    std::__detail::_List_node_base::_M_hook(p_Var2);
    psVar1 = &(this->values).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
              ._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    WaiterQueue<unsigned_long>::fulfill(&this->waiters,&local_20);
  }
  return;
}

Assistant:

void push(T v) {
    // Push an existing value onto the queue.

    if (!waiters.empty()) {
      // We have at least one waiter, give the value to the oldest.
      KJ_IASSERT(values.empty());

      // Fulfill the first waiter and return without store our value.
      waiters.fulfill(kj::mv(v));
    } else {
      // We don't have any waiters, store the value.
      values.push_front(kj::mv(v));
    }
  }